

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O3

size_t wabt::ReadU64Leb128(uint8_t *p,uint8_t *end,uint64_t *out_value)

{
  byte bVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  
  if ((p < end) && (uVar4 = (ulong)(char)*p, -1 < (long)uVar4)) {
    sVar2 = 1;
  }
  else if ((p + 1 < end) && (lVar3 = (long)(char)p[1], -1 < lVar3)) {
    uVar4 = (ulong)(*p & 0x7f) | lVar3 << 7;
    sVar2 = 2;
  }
  else if ((p + 2 < end) && (lVar3 = (long)(char)p[2], -1 < lVar3)) {
    uVar4 = (ulong)(*p & 0x7f | (p[1] & 0x7f) << 7) | lVar3 << 0xe;
    sVar2 = 3;
  }
  else if ((p + 3 < end) && (lVar3 = (long)(char)p[3], -1 < lVar3)) {
    uVar4 = (ulong)(*p & 0x7f | (p[1] & 0x7f) << 7 | (p[2] & 0x7f) << 0xe) | lVar3 << 0x15;
    sVar2 = 4;
  }
  else if ((p + 4 < end) && (lVar3 = (long)(char)p[4], -1 < lVar3)) {
    uVar4 = (ulong)(*p & 0x7f | (p[1] & 0x7f) << 7 | (p[2] & 0x7f) << 0xe | (p[3] & 0x7f) << 0x15) |
            lVar3 << 0x1c;
    sVar2 = 5;
  }
  else if ((p + 5 < end) && (lVar3 = (long)(char)p[5], -1 < lVar3)) {
    uVar4 = (ulong)(*p & 0x7f | (p[1] & 0x7f) << 7 | (p[2] & 0x7f) << 0xe | (p[3] & 0x7f) << 0x15) |
            (ulong)(p[4] & 0x7f) << 0x1c | lVar3 << 0x23;
    sVar2 = 6;
  }
  else if ((p + 6 < end) && (lVar3 = (long)(char)p[6], -1 < lVar3)) {
    uVar4 = (ulong)(*p & 0x7f | (p[1] & 0x7f) << 7 | (p[2] & 0x7f) << 0xe | (p[3] & 0x7f) << 0x15) |
            (ulong)(p[4] & 0x7f) << 0x1c | (ulong)(p[5] & 0x7f) << 0x23 | lVar3 << 0x2a;
    sVar2 = 7;
  }
  else if ((p + 7 < end) && (lVar3 = (long)(char)p[7], -1 < lVar3)) {
    uVar4 = (ulong)(*p & 0x7f | (p[1] & 0x7f) << 7 | (p[2] & 0x7f) << 0xe | (p[3] & 0x7f) << 0x15) |
            (ulong)(p[4] & 0x7f) << 0x1c | (ulong)(p[5] & 0x7f) << 0x23 |
            (ulong)(p[6] & 0x7f) << 0x2a | lVar3 << 0x31;
    sVar2 = 8;
  }
  else if ((p + 8 < end) && (lVar3 = (long)(char)p[8], -1 < lVar3)) {
    uVar4 = (ulong)(*p & 0x7f | (p[1] & 0x7f) << 7 | (p[2] & 0x7f) << 0xe | (p[3] & 0x7f) << 0x15) |
            (ulong)(p[4] & 0x7f) << 0x1c | (ulong)(p[5] & 0x7f) << 0x23 |
            (ulong)(p[6] & 0x7f) << 0x2a | (ulong)(p[7] & 0x7f) << 0x31 | lVar3 << 0x38;
    sVar2 = 9;
  }
  else {
    if (p + 9 < end) {
      bVar1 = p[9];
      if (-1 < (long)(char)bVar1) {
        if (1 < bVar1) {
          return 0;
        }
        uVar4 = (ulong)(*p & 0x7f | (p[1] & 0x7f) << 7 | (p[2] & 0x7f) << 0xe |
                       (p[3] & 0x7f) << 0x15) | (ulong)(p[4] & 0x7f) << 0x1c |
                (ulong)(p[5] & 0x7f) << 0x23 |
                (ulong)(p[6] & 0x7f) << 0x2a |
                (ulong)(p[7] & 0x7f) << 0x31 |
                (ulong)(p[8] & 0x7f) << 0x38 | (long)(char)bVar1 << 0x3f;
        sVar2 = 10;
        goto LAB_00133753;
      }
    }
    uVar4 = 0;
    sVar2 = 0;
  }
LAB_00133753:
  *out_value = uVar4;
  return sVar2;
}

Assistant:

size_t ReadU64Leb128(const uint8_t* p,
                     const uint8_t* end,
                     uint64_t* out_value) {
  if (p < end && (p[0] & 0x80) == 0) {
    *out_value = LEB128_1(uint64_t);
    return 1;
  } else if (p + 1 < end && (p[1] & 0x80) == 0) {
    *out_value = LEB128_2(uint64_t);
    return 2;
  } else if (p + 2 < end && (p[2] & 0x80) == 0) {
    *out_value = LEB128_3(uint64_t);
    return 3;
  } else if (p + 3 < end && (p[3] & 0x80) == 0) {
    *out_value = LEB128_4(uint64_t);
    return 4;
  } else if (p + 4 < end && (p[4] & 0x80) == 0) {
    *out_value = LEB128_5(uint64_t);
    return 5;
  } else if (p + 5 < end && (p[5] & 0x80) == 0) {
    *out_value = LEB128_6(uint64_t);
    return 6;
  } else if (p + 6 < end && (p[6] & 0x80) == 0) {
    *out_value = LEB128_7(uint64_t);
    return 7;
  } else if (p + 7 < end && (p[7] & 0x80) == 0) {
    *out_value = LEB128_8(uint64_t);
    return 8;
  } else if (p + 8 < end && (p[8] & 0x80) == 0) {
    *out_value = LEB128_9(uint64_t);
    return 9;
  } else if (p + 9 < end && (p[9] & 0x80) == 0) {
    // The top bits set represent values > 64 bits.
    if (p[9] & 0xfe) {
      return 0;
    }
    *out_value = LEB128_10(uint64_t);
    return 10;
  } else {
    // past the end.
    *out_value = 0;
    return 0;
  }
}